

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNormalizer.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::DOMNormalizer::normalizeDocument(DOMNormalizer *this,DOMDocumentImpl *doc)

{
  DOMNode *node;
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  DOMErrorHandler *pDVar2;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  DOMNode *pDVar3;
  
  this->fDocument = doc;
  iVar1 = (*(doc->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x62])(doc);
  this->fConfiguration = (DOMConfigurationImpl *)CONCAT44(extraout_var,iVar1);
  iVar1 = (*(this->fDocument->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x62])();
  if ((DOMConfigurationImpl *)CONCAT44(extraout_var_00,iVar1) == (DOMConfigurationImpl *)0x0) {
    pDVar2 = (DOMErrorHandler *)0x0;
  }
  else {
    pDVar2 = DOMConfigurationImpl::getErrorHandler
                       ((DOMConfigurationImpl *)CONCAT44(extraout_var_00,iVar1));
  }
  this->fErrorHandler = pDVar2;
  this->fNewNamespaceCount = 1;
  iVar1 = (*(doc->super_DOMMemoryManager)._vptr_DOMMemoryManager[0xc])(doc);
  node = (DOMNode *)CONCAT44(extraout_var_01,iVar1);
  while (node != (DOMNode *)0x0) {
    iVar1 = (*node->_vptr_DOMNode[10])(node);
    pDVar3 = normalizeNode(this,node);
    node = (DOMNode *)CONCAT44(extraout_var_02,iVar1);
    if (pDVar3 != (DOMNode *)0x0) {
      node = pDVar3;
    }
  }
  return;
}

Assistant:

void DOMNormalizer::normalizeDocument(DOMDocumentImpl *doc) {

    fDocument = doc;
    fConfiguration = (DOMConfigurationImpl*)doc->getDOMConfig();
    DOMConfigurationImpl *dci = (DOMConfigurationImpl*)fDocument->getDOMConfig();
    if(dci)
        fErrorHandler = dci->getErrorHandler();
    else
        fErrorHandler = 0;

    DOMNode *child = 0;
    DOMNode *next = 0;
    ((DOMNormalizer *)this)->fNewNamespaceCount = 1;

    for(child = doc->getFirstChild();child != 0; child = next) {
        next = child->getNextSibling();
        child = normalizeNode(child);
        if(child != 0) {
            next = child;
        }
    }
}